

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O3

void extent_maximally_purge(tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,edata_t *edata)

{
  locked_u64_t *plVar1;
  atomic_zu_t *paVar2;
  ulong uVar3;
  
  uVar3 = (edata->field_2).e_size_esn;
  duckdb_je_extent_dalloc_wrapper(tsdn,pac,ehooks,edata);
  LOCK();
  plVar1 = &(pac->stats->decay_dirty).nmadvise;
  (plVar1->val).repr = (plVar1->val).repr + 1;
  UNLOCK();
  LOCK();
  plVar1 = &(pac->stats->decay_dirty).purged;
  (plVar1->val).repr = (plVar1->val).repr + (uVar3 >> 0xc);
  UNLOCK();
  LOCK();
  paVar2 = &pac->stats->pac_mapped;
  paVar2->repr = paVar2->repr - (uVar3 & 0xfffffffffffff000);
  UNLOCK();
  return;
}

Assistant:

static void
extent_maximally_purge(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks,
    edata_t *edata) {
	size_t extent_size = edata_size_get(edata);
	extent_dalloc_wrapper(tsdn, pac, ehooks, edata);
	if (config_stats) {
		/* Update stats accordingly. */
		LOCKEDINT_MTX_LOCK(tsdn, *pac->stats_mtx);
		locked_inc_u64(tsdn,
		    LOCKEDINT_MTX(*pac->stats_mtx),
		    &pac->stats->decay_dirty.nmadvise, 1);
		locked_inc_u64(tsdn,
		    LOCKEDINT_MTX(*pac->stats_mtx),
		    &pac->stats->decay_dirty.purged,
		    extent_size >> LG_PAGE);
		LOCKEDINT_MTX_UNLOCK(tsdn, *pac->stats_mtx);
		atomic_fetch_sub_zu(&pac->stats->pac_mapped, extent_size,
		    ATOMIC_RELAXED);
	}
}